

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Reader capnp::_::WireHelpers::readDataPointer
                 (SegmentReader *segment,WirePointer *ref,word *refTarget,void *defaultValue,
                 BlobSize defaultSize)

{
  word *pwVar1;
  byte *value;
  WirePointer *segment_00;
  bool bVar2;
  uint uVar3;
  WordCount size_00;
  Fault local_f0;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  undefined1 local_d0 [8];
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> _kjCondition_1;
  Fault local_a0;
  Fault f;
  Kind local_90;
  DebugExpression<capnp::_::WirePointer::Kind> local_8c;
  undefined1 local_88 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  uint size;
  word *p;
  word *local_50;
  word *_p2510;
  word *ptr;
  byte *pbStack_38;
  BlobSize defaultSize_local;
  void *defaultValue_local;
  word *refTarget_local;
  WirePointer *ref_local;
  SegmentReader *segment_local;
  
  ptr._4_4_ = defaultSize;
  pbStack_38 = (byte *)defaultValue;
  defaultValue_local = refTarget;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer *)segment;
  bVar2 = WirePointer::isNull(ref);
  if (!bVar2) {
    followFars((WireHelpers *)&p,(WirePointer **)&refTarget_local,(word *)defaultValue_local,
               (SegmentReader **)&ref_local);
    local_50 = kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&p);
    if ((local_50 != (word *)0x0) && (_p2510 = local_50, local_50 != (word *)0x0)) {
      _kjCondition._28_4_ =
           WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
      local_90 = WirePointer::kind((WirePointer *)refTarget_local);
      local_8c = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
      f.exception._4_4_ = 1;
      kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
                ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_88,&local_8c,(Kind *)((long)&f.exception + 4));
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
      if (bVar2) {
        f_1.exception._6_1_ =
             WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
        f_1.exception._7_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (ElementSize *)((long)&f_1.exception + 6));
        f_1.exception._5_1_ = 2;
        kj::_::DebugExpression<capnp::ElementSize>::operator==
                  ((DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d0,
                   (DebugExpression<capnp::ElementSize> *)((long)&f_1.exception + 7),
                   (ElementSize *)((long)&f_1.exception + 5));
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
        segment_00 = ref_local;
        pwVar1 = _p2510;
        if (bVar2) {
          size_00 = roundBytesUpToWords(_kjCondition._28_4_);
          f_2.exception._6_1_ = boundsCheck((SegmentReader *)segment_00,pwVar1,size_00);
          f_2.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f_2.exception + 6));
          bVar2 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f_2.exception + 7));
          pwVar1 = _p2510;
          if (bVar2) {
            uVar3 = unbound<unsigned_int>(_kjCondition._28_4_);
            Data::Reader::Reader((Reader *)&segment_local,(byte *)pwVar1,(ulong)uVar3);
            return (Reader)_segment_local;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                    (&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9e8,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                     "_kjCondition,\"Message contained out-of-bounds data pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)((long)&f_2.exception + 7),
                     (char (*) [320])
                     "Message contained out-of-bounds data pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault(&local_f0);
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)&stack0xffffffffffffff20,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9e2,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where data was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d0,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where data was expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff20);
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  (&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9dc,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where data was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    local_88,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where data was expected.");
        kj::_::Debug::Fault::~Fault(&local_a0);
      }
    }
  }
  value = pbStack_38;
  uVar3 = unbound<unsigned_int>(ptr._4_4_);
  Data::Reader::Reader((Reader *)&segment_local,value,(ulong)uVar3);
  return (Reader)_segment_local;
}

Assistant:

static KJ_ALWAYS_INLINE(Data::Reader readDataPointer(
      SegmentReader* segment, const WirePointer* ref, const word* refTarget,
      const void* defaultValue, BlobSize defaultSize)) {
    if (ref->isNull()) {
    useDefault:
      return Data::Reader(reinterpret_cast<const byte*>(defaultValue),
          unbound(defaultSize / BYTES));
    } else {
      const word* ptr;
      KJ_IF_SOME(p, followFars(ref, refTarget, segment)) {
        ptr = &p;
      } else {
        goto useDefault;
      }

      if (KJ_UNLIKELY(ptr == nullptr)) {
        // Already reported error.
        goto useDefault;
      }

      auto size = ref->listRef.elementCount() * (ONE * BYTES / ELEMENTS);

      KJ_REQUIRE(ref->kind() == WirePointer::LIST,
                 "Schema mismatch: Message contains non-list pointer where data was expected.") {
        goto useDefault;
      }

      KJ_REQUIRE(ref->listRef.elementSize() == ElementSize::BYTE,
                 "Schema mismatch: Message contains list pointer of non-bytes where data was "
                 "expected.") {
        goto useDefault;
      }

      KJ_REQUIRE(boundsCheck(segment, ptr, roundBytesUpToWords(size)),
                 "Message contained out-of-bounds data pointer. "
                 OUT_OF_BOUNDS_ERROR_DETAIL) {
        goto useDefault;
      }

      return Data::Reader(reinterpret_cast<const byte*>(ptr), unbound(size / BYTES));
    }
  }